

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cl_half.h
# Opt level: O0

cl_half cl_half_handle_underflow(cl_half_rounding_mode rounding_mode,uint16_t sign)

{
  uint16_t sign_local;
  cl_half_rounding_mode rounding_mode_local;
  
  if ((rounding_mode == CL_HALF_RTP) && (sign == 0)) {
    sign_local = 1;
  }
  else if ((rounding_mode == CL_HALF_RTN) && (sign != 0)) {
    sign_local = sign << 0xf | 1;
  }
  else {
    sign_local = sign << 0xf;
  }
  return sign_local;
}

Assistant:

static inline cl_half cl_half_handle_underflow(cl_half_rounding_mode rounding_mode,
                                               uint16_t sign)
{
  if (rounding_mode == CL_HALF_RTP && !sign)
  {
    // Round underflow towards positive infinity -> smallest positive value
    return (sign << 15) | 1;
  }
  else if (rounding_mode == CL_HALF_RTN && sign)
  {
    // Round underflow towards negative infinity -> largest negative value
    return (sign << 15) | 1;
  }

  // Flush to zero
  return (sign << 15);
}